

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_register.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  boost::detail::test_impl
            ("tt == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_register.cpp"
             ,0x41,"int main()",true);
  boost::detail::test_impl
            ("tt == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_register.cpp"
             ,0x47,"int main()",true);
  boost::detail::test_impl
            ("tt == expected",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_register.cpp"
             ,0x4d,"int main()",true);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    {
        // expect static assertion failure: macro sheet equivalent functions cannot be thread-safe
        //constexpr auto attrs = attribute_set<tag::thread_safe, tag::macro_sheet_equivalent>();
        //constexpr auto tt = detail::type_text(func1, attrs);
    }
    {
        // expect static assertion failure: macro sheet equivalent functions cannot be cluster-safe
        //constexpr auto attrs = attribute_set<tag::cluster_safe, tag::macro_sheet_equivalent>();
        //constexpr auto tt = detail::type_text(func1, attrs);
    }
    {
        // expect static assertion failure: multiple async handles in argument list
        //constexpr auto tt = detail::type_text(error1, attribute_set<>());
    }
    {
        // expect static assertion failure: async functions must have void return type
        //constexpr auto tt = detail::type_text(error2, attribute_set<>());
    }
    {
        // expect static assertion failure: async functions cannot be cluster-safe
        //constexpr auto attrs = attribute_set<tag::cluster_safe>();
        //constexpr auto tt = detail::type_text(async1, attrs);
    }
    {
        constexpr auto attrs = attribute_set<tag::thread_safe>();
        constexpr auto tt = detail::type_text(async1, attrs);
        constexpr std::array<wchar_t, 3> expected{{ L'>', L'X', L'$' }};
        BOOST_TEST(tt == expected);
    }
    {
        constexpr auto attrs = attribute_set<tag::volatile_>();
        constexpr auto tt = detail::type_text(func1, attrs);
        constexpr std::array<wchar_t, 3> expected{{ L'C', L'Q', L'!' }};
        BOOST_TEST(tt == expected);
    }
    {
        constexpr auto attrs = attribute_set<tag::cluster_safe>();
        constexpr auto tt = detail::type_text(func1, attrs);
        constexpr std::array<wchar_t, 3> expected{{ L'C', L'Q', L'&' }};
        BOOST_TEST(tt == expected);
    }

    return boost::report_errors();
}